

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_struct_result_writer
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool pointers)

{
  int *piVar1;
  long lVar2;
  t_field *tfield;
  string *psVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 in_register_00000009;
  pointer pptVar6;
  t_cpp_generator *this_00;
  _Alloc_hider _Var7;
  bool bVar8;
  string name;
  string local_140;
  t_struct *local_120;
  string local_118;
  undefined4 local_f4;
  string local_f0;
  string local_d0;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  local_f4 = (undefined4)CONCAT71(in_register_00000009,pointers);
  local_120 = tstruct;
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  local_b0 = local_a0;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
  if (this->gen_templates_ == true) {
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_140._M_dataplus._M_p,local_140._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"template <class Protocol_>",0x1a);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"uint32_t ",9);
    iVar4 = (*(local_120->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_00,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"::write(Protocol_* oprot) const {",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
  }
  else {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"uint32_t ",9);
    iVar4 = (*(local_120->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_01,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar4))[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"::write(::apache::thrift::protocol::TProtocol* oprot) const {",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"uint32_t xfer = 0;",0x12);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"xfer += oprot->writeStructBegin(\"",0x21);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\");",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar6 = (local_120->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (local_120->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar8 = true;
    do {
      if (bVar8) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if ",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        bVar8 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(out," else if ",9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"(this->__isset.",0xf);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,((*pptVar6)->name_)._M_dataplus._M_p,
                          ((*pptVar6)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"xfer += oprot->writeFieldBegin(",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,((*pptVar6)->name_)._M_dataplus._M_p,
                          ((*pptVar6)->name_)._M_string_length);
      this_00 = (t_cpp_generator *)0x38b673;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\", ",3);
      type_to_enum_abi_cxx11_(&local_118,this_00,(*pptVar6)->type_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*pptVar6)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      tfield = *pptVar6;
      if ((char)local_f4 == '\0') {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"this->","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
        generate_serialize_field(this,out,tfield,&local_f0,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        psVar3 = &local_f0;
        _Var7._M_p = local_f0._M_dataplus._M_p;
      }
      else {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"(*(this->","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"))","");
        generate_serialize_field(this,out,tfield,&local_d0,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        psVar3 = &local_d0;
        _Var7._M_p = local_d0._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &psVar3->field_2) {
        operator_delete(_Var7._M_p);
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"xfer += oprot->writeFieldEnd();",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (local_120->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"xfer += oprot->writeFieldStop();",0x20)
  ;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"xfer += oprot->writeStructEnd();",0x20)
  ;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return xfer;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_struct_result_writer(ostream& out,
                                                    t_struct* tstruct,
                                                    bool pointers) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_templates_) {
    out << indent() << "template <class Protocol_>" << endl << indent() << "uint32_t "
        << tstruct->get_name() << "::write(Protocol_* oprot) const {" << endl;
  } else {
    indent(out) << "uint32_t " << tstruct->get_name()
                << "::write(::apache::thrift::protocol::TProtocol* oprot) const {" << endl;
  }
  indent_up();

  out << endl << indent() << "uint32_t xfer = 0;" << endl << endl;

  indent(out) << "xfer += oprot->writeStructBegin(\"" << name << "\");" << endl;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << endl << indent() << "if ";
    } else {
      out << " else if ";
    }

    out << "(this->__isset." << (*f_iter)->get_name() << ") {" << endl;

    indent_up();

    // Write field header
    out << indent() << "xfer += oprot->writeFieldBegin("
        << "\"" << (*f_iter)->get_name() << "\", " << type_to_enum((*f_iter)->get_type()) << ", "
        << (*f_iter)->get_key() << ");" << endl;
    // Write field contents
    if (pointers) {
      generate_serialize_field(out, *f_iter, "(*(this->", "))");
    } else {
      generate_serialize_field(out, *f_iter, "this->");
    }
    // Write field closer
    indent(out) << "xfer += oprot->writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}";
  }

  // Write the struct map
  out << endl << indent() << "xfer += oprot->writeFieldStop();" << endl << indent()
      << "xfer += oprot->writeStructEnd();" << endl << indent() << "return xfer;" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;
}